

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_ledger.cpp
# Opt level: O3

ByteData * __thiscall
cfd::api::LedgerApi::Serialize
          (ByteData *__return_storage_ptr__,LedgerApi *this,ConfidentialTransactionContext *tx,
          vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
          *metadata_stack,bool skip_witness,bool is_authorization)

{
  byte bVar1;
  pointer pLVar2;
  pointer puVar3;
  uint uVar4;
  _func_int **pp_Var5;
  undefined8 uVar6;
  uint uVar7;
  bool bVar8;
  int iVar9;
  int32_t iVar10;
  uint32_t uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long *plVar13;
  CfdException *this_00;
  ulong uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  _Alloc_hider _Var16;
  uint32_t index;
  ulong uVar17;
  size_t sVar18;
  string *psVar19;
  LedgerMetaDataStackItem empty_item;
  uint32_t sequence;
  ByteData256 issuance_hash;
  ByteData issuance;
  ConfidentialTxOutReference txout;
  ByteData local_418;
  ByteData local_3f8;
  ConfidentialValue local_3d8;
  ConfidentialAssetId local_3a8;
  string local_378;
  long local_358;
  ConfidentialTransactionContext *local_350;
  string local_348;
  undefined1 local_328 [48];
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [32];
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [24];
  ByteData local_290;
  Script local_278;
  ByteData local_238;
  ByteData local_218;
  ByteData local_200;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  ulong local_1d0;
  vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
  *local_1c8;
  ByteData local_1c0;
  undefined1 local_1a8 [40];
  uint local_180;
  undefined1 local_178 [56];
  uint32_t local_140;
  undefined1 local_130 [40];
  undefined1 local_108 [72];
  ConfidentialValue local_c0 [3];
  ByteData local_48;
  
  local_350 = tx;
  local_1c8 = metadata_stack;
  iVar9 = (*(tx->super_ConfidentialTransaction).super_AbstractTransaction._vptr_AbstractTransaction
            [7])(tx);
  core::ByteData::ByteData(__return_storage_ptr__);
  core::ByteData::ByteData(&local_238);
  core::ByteData::ByteData(&local_1c0);
  iVar10 = core::AbstractTransaction::GetVersion((AbstractTransaction *)local_350);
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((long)local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 4);
  *(int32_t *)
   local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = iVar10;
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  core::ByteData::ByteData((ByteData *)local_1a8,&local_1e8);
  core::ByteData::Push(__return_storage_ptr__,(ByteData *)local_1a8);
  bVar1 = (byte)iVar9 & (!skip_witness && !is_authorization);
  if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (bVar1 != 0) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"0001","");
    core::ByteData::ByteData((ByteData *)local_2f8,(string *)local_1a8);
    core::ByteData::Push(__return_storage_ptr__,(ByteData *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_2f8._0_8_);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
  }
  uVar11 = core::ConfidentialTransaction::GetTxInCount(&local_350->super_ConfidentialTransaction);
  core::ByteData::GetVariableInt((ByteData *)local_1a8,(ulong)uVar11);
  core::ByteData::Push(__return_storage_ptr__,(ByteData *)local_1a8);
  if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (uVar11 != 0) {
    index = 0;
    local_358 = CONCAT44(local_358._4_4_,uVar11);
    do {
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2f8 + 0x10);
      core::ConfidentialTransaction::GetTxIn
                ((ConfidentialTxInReference *)local_1a8,&local_350->super_ConfidentialTransaction,
                 index);
      core::ByteData::ByteData(&local_418);
      uVar7 = local_180;
      local_3a8._vptr_ConfidentialAssetId = (_func_int **)operator_new(4);
      uVar4 = uVar7 & 0x3fffffff;
      if (!is_authorization) {
        uVar4 = uVar7;
      }
      local_3a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)local_3a8._vptr_ConfidentialAssetId + 4);
      *(uint *)local_3a8._vptr_ConfidentialAssetId = uVar4;
      local_3a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_3a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      core::Txid::Txid((Txid *)local_2f8,(Txid *)(local_1a8 + 8));
      core::Txid::GetData((ByteData *)&local_278,(Txid *)local_2f8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_418,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._vptr_Script !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_278._vptr_Script);
      }
      local_2f8._0_8_ = &PTR__Txid_00723450;
      if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_2f8._8_8_);
      }
      core::ByteData::ByteData
                ((ByteData *)local_2f8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3a8);
      core::ByteData::Push(&local_418,(ByteData *)local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_2f8._0_8_);
      }
      if (!is_authorization) {
        core::Script::Script((Script *)local_2f8,(Script *)local_178);
        core::Script::GetData((ByteData *)&local_3d8,(Script *)local_2f8);
        core::ByteData::Serialize((ByteData *)&local_278,(ByteData *)&local_3d8);
        core::ByteData::Push(&local_418,(ByteData *)&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._vptr_Script !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_278._vptr_Script);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._vptr_ConfidentialValue !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_3d8._vptr_ConfidentialValue);
        }
        core::Script::~Script((Script *)local_2f8);
      }
      local_290.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = local_140;
      memcpy(local_3a8._vptr_ConfidentialAssetId,&local_290,
             (long)local_3a8.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start - (long)local_3a8._vptr_ConfidentialAssetId);
      core::ByteData::ByteData
                ((ByteData *)local_2f8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3a8);
      core::ByteData::Push(&local_418,(ByteData *)local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_2f8._0_8_);
      }
      if (is_authorization) {
        core::ConfidentialValue::ConfidentialValue
                  ((ConfidentialValue *)local_2f8,(ConfidentialValue *)(local_108 + 0x20));
        bVar8 = core::ConfidentialValue::IsEmpty((ConfidentialValue *)local_2f8);
        if (bVar8) {
          core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&local_278,local_c0);
          bVar8 = core::ConfidentialValue::IsEmpty((ConfidentialValue *)&local_278);
          local_278._vptr_Script = (_func_int **)&PTR__ConfidentialValue_00723840;
          if (local_278.script_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_278.script_data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          bVar8 = false;
        }
        local_2f8._0_8_ = &PTR__ConfidentialValue_00723840;
        if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_2f8._8_8_);
        }
        if (bVar8 == false) {
          core::ConfidentialValue::ConfidentialValue
                    ((ConfidentialValue *)local_2f8,(ConfidentialValue *)(local_108 + 0x20));
          core::ConfidentialValue::GetData((ByteData *)&local_278,(ConfidentialValue *)local_2f8);
          local_2f8._0_8_ = &PTR__ConfidentialValue_00723840;
          if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_2f8._8_8_);
          }
          bVar8 = core::ByteData::IsEmpty((ByteData *)&local_278);
          if (bVar8) {
            local_2f8._8_8_ = (pointer)0x2;
            local_2f8._16_3_ = 0x3030;
            local_2f8._0_8_ = paVar12;
            core::ByteData::ByteData((ByteData *)&local_3d8,(string *)local_2f8);
            pp_Var5 = local_278._vptr_Script;
            local_278._vptr_Script = local_3d8._vptr_ConfidentialValue;
            local_278.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_3d8.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_278.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_3d8.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_3d8._vptr_ConfidentialValue = (_func_int **)0x0;
            local_3d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_3d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pp_Var5 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0) &&
               (operator_delete(pp_Var5),
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3d8._vptr_ConfidentialValue !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0)) {
              operator_delete(local_3d8._vptr_ConfidentialValue);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._0_8_ != paVar12) {
              operator_delete((void *)local_2f8._0_8_);
            }
          }
          core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_2f8,local_c0);
          core::ConfidentialValue::GetData((ByteData *)&local_3d8,(ConfidentialValue *)local_2f8);
          local_2f8._0_8_ = &PTR__ConfidentialValue_00723840;
          if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_2f8._8_8_);
          }
          bVar8 = core::ByteData::IsEmpty((ByteData *)&local_3d8);
          if (bVar8) {
            local_2f8._8_8_ = (pointer)0x2;
            local_2f8._16_3_ = 0x3030;
            local_2f8._0_8_ = paVar12;
            core::ByteData::ByteData((ByteData *)local_328,(string *)local_2f8);
            pp_Var5 = local_3d8._vptr_ConfidentialValue;
            local_3d8._vptr_ConfidentialValue = (_func_int **)local_328._0_8_;
            local_3d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_328._8_8_;
            local_3d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_328._16_8_;
            local_328._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_328._8_8_ = (pointer)0x0;
            local_328._16_8_ = (pointer)0x0;
            if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pp_Var5 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0) &&
               (operator_delete(pp_Var5),
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_328._0_8_ !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0)) {
              operator_delete((void *)local_328._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._0_8_ != paVar12) {
              operator_delete((void *)local_2f8._0_8_);
            }
          }
          core::ByteData::ByteData((ByteData *)local_2f8);
          local_378._M_dataplus._M_p = (pointer)0x0;
          local_378._M_string_length = 0;
          local_378.field_2._M_allocated_capacity = 0;
          uVar14 = local_130._32_8_ - local_130._24_8_;
          if (uVar14 == 0) {
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
            sVar18 = 0;
          }
          else {
            if ((long)uVar14 < 0) {
              std::__throw_bad_alloc();
            }
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)operator_new(uVar14);
            sVar18 = local_130._32_8_ - local_130._24_8_;
          }
          local_378.field_2._M_allocated_capacity = uVar14 + (long)paVar12;
          local_378._M_dataplus._M_p = (pointer)paVar12;
          if (local_130._32_8_ != local_130._24_8_) {
            local_378._M_string_length = (size_type)paVar12;
            memmove(paVar12,(void *)local_130._24_8_,sVar18);
          }
          local_378._M_string_length = (long)paVar12 + sVar18;
          local_348._M_dataplus._M_p = (pointer)0x0;
          local_348._M_string_length = 0;
          local_348.field_2._M_allocated_capacity = 0;
          uVar14 = local_108._16_8_ - local_108._8_8_;
          if (uVar14 == 0) {
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
            sVar18 = 0;
          }
          else {
            if ((long)uVar14 < 0) {
              std::__throw_bad_alloc();
            }
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)operator_new(uVar14);
            sVar18 = local_108._16_8_ - local_108._8_8_;
          }
          local_348.field_2._M_allocated_capacity = uVar14 + (long)paVar12;
          local_348._M_dataplus._M_p = (pointer)paVar12;
          if (local_108._16_8_ != local_108._8_8_) {
            local_348._M_string_length = (size_type)paVar12;
            memmove(paVar12,(void *)local_108._8_8_,sVar18);
          }
          local_348._M_string_length = (long)paVar12 + sVar18;
          core::ByteData::
          Concat<cfd::core::ByteData256,cfd::core::ByteData256,cfd::core::ByteData,cfd::core::ByteData>
                    ((ByteData *)local_328,(ByteData *)local_2f8,(ByteData256 *)&local_378,
                     (ByteData256 *)&local_348,(ByteData *)&local_278,(ByteData *)&local_3d8);
          uVar6 = local_2f8._0_8_;
          local_2f8._0_8_ = local_328._0_8_;
          local_2f8._8_8_ = local_328._8_8_;
          local_2f8._16_8_ = local_328._16_8_;
          local_328._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_328._8_8_ = (pointer)0x0;
          local_328._16_8_ = (pointer)0x0;
          uVar11 = (uint32_t)local_358;
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)uVar6 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) &&
             (operator_delete((void *)uVar6),
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_328._0_8_ !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0)) {
            operator_delete((void *)local_328._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_348._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_378._M_dataplus._M_p);
          }
          core::ByteData::Push(&local_1c0,(ByteData *)local_2f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete((void *)local_2f8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._vptr_ConfidentialValue !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_3d8._vptr_ConfidentialValue);
          }
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_278._vptr_Script;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._vptr_Script !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) goto LAB_003b9757;
        }
        else {
          local_2f8._8_8_ = (pointer)0x2;
          local_2f8._16_3_ = 0x3030;
          local_2f8._0_8_ = paVar12;
          core::ByteData::ByteData((ByteData *)&local_278,(string *)local_2f8);
          core::ByteData::Push(&local_1c0,(ByteData *)&local_278);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._vptr_Script !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_278._vptr_Script);
          }
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f8._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._0_8_ != paVar12) {
LAB_003b9757:
            operator_delete(paVar15);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._vptr_ConfidentialAssetId !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_3a8._vptr_ConfidentialAssetId);
      }
      puVar3 = local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
      local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)puVar3 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) &&
         (operator_delete(puVar3),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0)) {
        operator_delete(local_418.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)local_1a8);
      core::ByteData::Push(__return_storage_ptr__,&local_238);
      index = index + 1;
    } while (uVar11 != index);
  }
  local_2f8._0_8_ = local_2f8 + 0x10;
  local_2f8._8_8_ = (pointer)0x0;
  local_2f8._16_8_ = local_2f8._16_8_ & 0xffffffffffffff00;
  local_2d8._0_8_ = local_2d8 + 0x10;
  local_2d8._8_8_ = (pointer)0x0;
  local_2d8[0x10] = '\0';
  local_2b8 = local_2a8;
  local_2b0 = 0;
  local_2a8[0] = 0;
  uVar11 = core::ConfidentialTransaction::GetTxOutCount(&local_350->super_ConfidentialTransaction);
  local_1d0 = (ulong)uVar11;
  core::ByteData::GetVariableInt((ByteData *)local_1a8,local_1d0);
  core::ByteData::Push(__return_storage_ptr__,(ByteData *)local_1a8);
  if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (uVar11 != 0) {
    local_358 = 0x20;
    uVar14 = 0;
    do {
      core::ConfidentialTransaction::GetTxOut
                ((ConfidentialTxOutReference *)local_1a8,&local_350->super_ConfidentialTransaction,
                 (uint32_t)uVar14);
      pLVar2 = (local_1c8->
               super__Vector_base<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar17 = ((long)(local_1c8->
                      super__Vector_base<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >> 5) *
               -0x5555555555555555;
      if (uVar17 < uVar14 || uVar17 - uVar14 == 0) {
        psVar19 = (string *)local_2f8;
      }
      else {
        psVar19 = (string *)((long)pLVar2 + local_358 + -0x20);
      }
      core::ByteData::ByteData(&local_3f8);
      if (is_authorization) {
        core::ConfidentialValue::ConfidentialValue
                  ((ConfidentialValue *)&local_278,(ConfidentialValue *)local_130);
        bVar8 = core::ConfidentialValue::HasBlinding((ConfidentialValue *)&local_278);
        local_278._vptr_Script = (_func_int **)&PTR__ConfidentialValue_00723840;
        if (local_278.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_278.script_data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (!bVar8) {
          core::ConfidentialAssetId::ConfidentialAssetId
                    (&local_3a8,(ConfidentialAssetId *)(local_178 + 0x20));
          core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_328,&local_3a8);
          core::ByteData::ByteData(&local_290,(string *)local_328);
          core::ConfidentialValue::ConfidentialValue(&local_3d8,(ConfidentialValue *)local_130);
          core::ConfidentialValue::GetHex_abi_cxx11_(&local_348,&local_3d8);
          std::__cxx11::string::substr((ulong)&local_378,(ulong)&local_348);
          core::ByteData::ByteData(&local_218,&local_378);
          core::Script::Script(&local_278,(Script *)(local_1a8 + 0x18));
          core::Script::GetData(&local_48,&local_278);
          core::ByteData::Serialize(&local_200,&local_48);
          core::ByteData::Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
                    (&local_418,&local_3f8,&local_290,&local_218,&local_200);
          puVar3 = local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((puVar3 != (pointer)0x0) &&
             (operator_delete(puVar3),
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0)) {
            operator_delete(local_418.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_200.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_200.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          core::Script::~Script(&local_278);
          if (local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_218.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p);
          }
          local_3d8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
          if (local_3d8.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_3d8.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_290.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint32_t)
                                local_290.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
LAB_003ba34c:
          if (paVar12 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(paVar12);
          }
          _Var16._M_p = (pointer)local_328._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_328 + 0x10)) goto LAB_003b9f05;
          goto LAB_003b9f0a;
        }
        if (uVar17 < uVar14 || uVar17 - uVar14 == 0) {
          plVar13 = (long *)(local_2f8 + 8);
        }
        else {
          plVar13 = (long *)((long)pLVar2 + local_358 + -0x18);
        }
        if (*plVar13 == 0) {
          core::ConfidentialAssetId::ConfidentialAssetId
                    (&local_3a8,(ConfidentialAssetId *)(local_178 + 0x20));
          core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_328,&local_3a8);
          core::ByteData::ByteData(&local_418,(string *)local_328);
          core::ConfidentialValue::ConfidentialValue(&local_3d8,(ConfidentialValue *)local_130);
          core::ConfidentialValue::GetHex_abi_cxx11_(&local_378,&local_3d8);
          core::ByteData::ByteData(&local_290,&local_378);
          core::Script::Script(&local_278,(Script *)(local_1a8 + 0x18));
          core::Script::GetData(&local_200,&local_278);
          core::ByteData::Serialize(&local_218,&local_200);
          core::ByteData::Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
                    ((ByteData *)&local_348,&local_3f8,&local_418,&local_290,&local_218);
          puVar3 = local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_348._M_dataplus._M_p;
          local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_348._M_string_length;
          local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_348.field_2._M_allocated_capacity;
          local_348._M_dataplus._M_p = (pointer)0x0;
          local_348._M_string_length = 0;
          local_348.field_2._M_allocated_capacity = 0;
          if ((puVar3 != (pointer)0x0) &&
             (operator_delete(puVar3),
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_348._M_dataplus._M_p !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0)) {
            operator_delete(local_348._M_dataplus._M_p);
          }
          if (local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_218.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_200.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_200.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          core::Script::~Script(&local_278);
          if ((void *)CONCAT44(local_290.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               (uint32_t)
                               local_290.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_290.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (uint32_t)
                                             local_290.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p);
          }
          local_3d8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
          if (local_3d8.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_3d8.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          }
          goto LAB_003ba34c;
        }
        core::ByteData::ByteData((ByteData *)&local_3d8,psVar19);
        if (uVar17 < uVar14 || uVar17 - uVar14 == 0) {
          psVar19 = (string *)local_2d8;
        }
        else {
          psVar19 = (string *)((long)&(pLVar2->metadata1)._M_dataplus._M_p + local_358);
        }
        core::ByteData::ByteData((ByteData *)local_328,psVar19);
        core::Script::Script(&local_278,(Script *)(local_1a8 + 0x18));
        core::Script::GetData((ByteData *)&local_348,&local_278);
        core::ByteData::Serialize((ByteData *)&local_378,(ByteData *)&local_348);
        core::ByteData::Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
                  ((ByteData *)&local_3a8,&local_3f8,(ByteData *)&local_3d8,(ByteData *)local_328,
                   (ByteData *)&local_378);
        puVar3 = local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_3a8._vptr_ConfidentialAssetId;
        local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_3a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_3a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_3a8._vptr_ConfidentialAssetId = (_func_int **)0x0;
        local_3a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if ((puVar3 != (pointer)0x0) &&
           (operator_delete(puVar3),
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_3a8._vptr_ConfidentialAssetId !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) {
          operator_delete(local_3a8._vptr_ConfidentialAssetId);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_378._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_348._M_dataplus._M_p);
        }
        core::Script::~Script(&local_278);
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8._vptr_ConfidentialValue;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_328._0_8_);
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8._vptr_ConfidentialValue;
        }
      }
      else {
        core::ConfidentialAssetId::ConfidentialAssetId
                  (&local_3a8,(ConfidentialAssetId *)(local_178 + 0x20));
        core::ConfidentialAssetId::GetData((ByteData *)&local_348,&local_3a8);
        core::ConfidentialValue::ConfidentialValue(&local_3d8,(ConfidentialValue *)local_130);
        core::ConfidentialValue::GetData(&local_418,&local_3d8);
        core::ConfidentialNonce::ConfidentialNonce
                  ((ConfidentialNonce *)local_328,(ConfidentialNonce *)local_108);
        core::ConfidentialNonce::GetData(&local_290,(ConfidentialNonce *)local_328);
        core::Script::Script(&local_278,(Script *)(local_1a8 + 0x18));
        core::Script::GetData(&local_200,&local_278);
        core::ByteData::Serialize(&local_218,&local_200);
        core::ByteData::
        Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
                  ((ByteData *)&local_378,&local_3f8,(ByteData *)&local_348,&local_418,&local_290,
                   &local_218);
        puVar3 = local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_378._M_dataplus._M_p;
        local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_378._M_string_length;
        local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_378.field_2._M_allocated_capacity
        ;
        local_378._M_dataplus._M_p = (pointer)0x0;
        local_378._M_string_length = 0;
        local_378.field_2._M_allocated_capacity = 0;
        if ((puVar3 != (pointer)0x0) &&
           (operator_delete(puVar3),
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_378._M_dataplus._M_p !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) {
          operator_delete(local_378._M_dataplus._M_p);
        }
        if (local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_218.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_200.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_200.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        core::Script::~Script(&local_278);
        if ((void *)CONCAT44(local_290.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             (uint32_t)
                             local_290.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_290.data_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           (uint32_t)
                                           local_290.data_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start));
        }
        local_328._0_8_ = &PTR__ConfidentialNonce_00723710;
        if ((pointer)local_328._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_328._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_418.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_3d8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
        if (local_3d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3d8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        _Var16._M_p = local_348._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
LAB_003b9f05:
          operator_delete(_Var16._M_p);
        }
LAB_003b9f0a:
        local_3a8._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      }
      if (paVar12 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(paVar12);
      }
      puVar3 = local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
      local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)puVar3 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) &&
         (operator_delete(puVar3),
         local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_3f8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      core::ByteData::Push(__return_storage_ptr__,&local_238);
      core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)local_1a8);
      uVar14 = uVar14 + 1;
      local_358 = local_358 + 0x60;
    } while (local_1d0 != uVar14);
  }
  if (bVar1 != 0) {
    uVar11 = core::AbstractTransaction::GetLockTime((AbstractTransaction *)local_350);
    local_278._vptr_Script = (_func_int **)CONCAT44(local_278._vptr_Script._4_4_,uVar11);
    memcpy(local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,&local_278,
           (long)local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start);
    core::ByteData::ByteData((ByteData *)local_1a8,&local_1e8);
    core::ByteData::Push(__return_storage_ptr__,(ByteData *)local_1a8);
    if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1a8._0_8_);
    }
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Witness serialization is not implemented.","");
    core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_1a8);
    __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (is_authorization) {
    core::HashUtil::Sha256((ByteData256 *)local_1a8,__return_storage_ptr__);
    core::HashUtil::Sha256((ByteData256 *)&local_278,&local_1c0);
    core::ByteData256::Concat<cfd::core::ByteData256>
              ((ByteData *)&local_3a8,(ByteData256 *)local_1a8,(ByteData256 *)&local_278);
    puVar3 = (__return_storage_ptr__->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (__return_storage_ptr__->data_).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_3a8._vptr_ConfidentialAssetId;
    (__return_storage_ptr__->data_).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_3a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->data_).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_3a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_3a8._vptr_ConfidentialAssetId = (_func_int **)0x0;
    local_3a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((puVar3 != (pointer)0x0) &&
       (operator_delete(puVar3),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_3a8._vptr_ConfidentialAssetId !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      operator_delete(local_3a8._vptr_ConfidentialAssetId);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._vptr_Script !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_278._vptr_Script);
    }
    if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1a8._0_8_);
    }
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
    operator_delete((void *)local_2d8._0_8_);
  }
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_);
  }
  if ((int32_t *)
      local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (int32_t *)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_238.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData LedgerApi::Serialize(
    const ConfidentialTransactionContext& tx,
    const std::vector<LedgerMetaDataStackItem>& metadata_stack,
    bool skip_witness, bool is_authorization) const {
  static auto serialize_input_function =
      [](const ConfidentialTxInReference& txin, bool is_authorization,
         ByteData* issuance) -> ByteData {
    ByteData txin_bytes;
    uint32_t vout = txin.GetVout();
    if (is_authorization) {
      vout &= 0x3fffffff;  // ignore flag
    }
    std::vector<uint8_t> byte_data(sizeof(vout));
    memcpy(byte_data.data(), &vout, byte_data.size());
    txin_bytes = txin.GetTxid().GetData();
    txin_bytes.Push(ByteData(byte_data));
    if (!is_authorization) {
      txin_bytes.Push(txin.GetUnlockingScript().GetData().Serialize());
    }
    uint32_t sequence = txin.GetSequence();
    memcpy(byte_data.data(), &sequence, byte_data.size());
    txin_bytes.Push(ByteData(byte_data));

    if (!issuance || !is_authorization) {
      // do nothing
    } else if (
        txin.GetIssuanceAmount().IsEmpty() &&
        txin.GetInflationKeys().IsEmpty()) {
      issuance->Push(ByteData("00"));
    } else {
      ByteData asset = txin.GetIssuanceAmount().GetData();
      if (asset.IsEmpty()) asset = ByteData("00");
      ByteData token = txin.GetInflationKeys().GetData();
      if (token.IsEmpty()) token = ByteData("00");
      ByteData issuance_bytes;
      issuance_bytes = issuance_bytes.Concat(
          txin.GetBlindingNonce(), txin.GetAssetEntropy(), asset, token);
      issuance->Push(issuance_bytes);
    }
    return txin_bytes;
  };

  static auto serialize_output_function =
      [](const ConfidentialTxOutReference& txout, bool is_authorization,
         const LedgerMetaDataStackItem& metadata) -> ByteData {
    ByteData txout_bytes;
    if (!is_authorization) {
      txout_bytes = txout_bytes.Concat(
          txout.GetAsset().GetData(), txout.GetConfidentialValue().GetData(),
          txout.GetNonce().GetData(),
          txout.GetLockingScript().GetData().Serialize());
    } else if (!txout.GetConfidentialValue().HasBlinding()) {
      txout_bytes = txout_bytes.Concat(
          ByteData(txout.GetAsset().GetHex()),
          ByteData(txout.GetConfidentialValue().GetHex().substr(2)),
          txout.GetLockingScript().GetData().Serialize());
    } else if (!metadata.metadata1.empty()) {
      txout_bytes = txout_bytes.Concat(
          ByteData(metadata.metadata1), ByteData(metadata.metadata2),
          txout.GetLockingScript().GetData().Serialize());
    } else {
      txout_bytes = txout_bytes.Concat(
          ByteData(txout.GetAsset().GetHex()),
          ByteData(txout.GetConfidentialValue().GetHex()),
          txout.GetLockingScript().GetData().Serialize());
    }
    return txout_bytes;
  };

  bool has_witness = (tx.HasWitness() && !skip_witness && !is_authorization);
  ByteData data;
  ByteData temp_data;
  ByteData issuance;

  // version
  int32_t version = tx.GetVersion();
  std::vector<uint8_t> byte_data(sizeof(version));
  memcpy(byte_data.data(), &version, byte_data.size());
  data.Push(ByteData(byte_data));

  // marker & flag (equivalent to bitcoin format)
  if (has_witness) {
    data.Push(ByteData("0001"));
  }

  uint32_t txin_count = tx.GetTxInCount();
  data.Push(ByteData::GetVariableInt(txin_count));
  for (uint32_t index = 0; index < txin_count; ++index) {
    temp_data = serialize_input_function(
        tx.GetTxIn(index), is_authorization, &issuance);
    data.Push(temp_data);
  }

  LedgerMetaDataStackItem empty_item;
  uint32_t txout_count = tx.GetTxOutCount();
  data.Push(ByteData::GetVariableInt(txout_count));
  for (uint32_t index = 0; index < txout_count; ++index) {
    auto txout = tx.GetTxOut(index);
    temp_data = serialize_output_function(
        txout, is_authorization,
        (metadata_stack.size() > index) ? metadata_stack.at(index)
                                        : empty_item);
    data.Push(temp_data);
  }

  if (has_witness) {
    // locktime
    uint32_t locktime = tx.GetLockTime();
    memcpy(byte_data.data(), &locktime, byte_data.size());
    data.Push(ByteData(byte_data));

    // issue rangeproof, token rangeproof, witness, pegin witness
    // surjectionproof, rangeproof
    // FIXME(k-matsuzawa): not implement
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        "Witness serialization is not implemented.");
  }

  if (is_authorization) {
    ByteData256 tx_hash = HashUtil::Sha256(data);
    ByteData256 issuance_hash = HashUtil::Sha256(issuance);
    data = tx_hash.Concat(issuance_hash);
  }

  return data;
}